

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitcoin-tx.cpp
# Opt level: O3

uint TrimAndParse<unsigned_int>(string *int_str,string *err)

{
  pointer pcVar1;
  undefined1 auVar2 [16];
  void *pvVar3;
  size_type sVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  undefined8 *puVar6;
  runtime_error *prVar7;
  runtime_error *prVar8;
  ulong uVar9;
  long in_FS_OFFSET;
  __integer_from_chars_result_type<unsigned_int> _Var10;
  undefined1 auVar11 [16];
  uint result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string_view<char,_std::char_traits<char>_> local_58;
  size_type local_48;
  undefined8 uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar1 = (int_str->_M_dataplus)._M_p;
  prVar7 = (runtime_error *)int_str->_M_string_length;
  local_58._M_len = (size_t)prVar7;
  local_58._M_str = pcVar1;
  if (prVar7 != (runtime_error *)0x0) {
    prVar8 = (runtime_error *)0x0;
    do {
      pvVar3 = memchr(" \f\n\r\t\v",(int)pcVar1[(long)prVar8],6);
      if (pvVar3 == (void *)0x0) {
        if (prVar8 != (runtime_error *)0xffffffffffffffff) {
          sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::find_last_not_of
                            (&local_58," \f\n\r\t\v",0xffffffffffffffff,6);
          if (local_58._M_len < prVar8) {
            if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_0011de72;
            auVar11 = std::__throw_out_of_range_fmt
                                ("%s: __pos (which is %zu) > __size (which is %zu)",
                                 "basic_string_view::substr",prVar8);
            goto LAB_0011dd60;
          }
          uVar9 = (sVar4 - (long)prVar8) + 1;
          if (local_58._M_len - (long)prVar8 < uVar9) {
            uVar9 = local_58._M_len - (long)prVar8;
          }
          prVar8 = prVar8 + (long)local_58._M_str;
          goto LAB_0011dc85;
        }
        break;
      }
      prVar8 = prVar8 + 1;
    } while (prVar7 != prVar8);
  }
  uVar9 = 0;
  prVar8 = (runtime_error *)0x0;
LAB_0011dc85:
  _Var10 = std::from_chars<unsigned_int>
                     ((char *)prVar8,(char *)(prVar8 + uVar9),(uint *)&local_58,10);
  if (((runtime_error *)_Var10.ptr == prVar8 + uVar9) && (_Var10.ec == 0)) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return (uint)local_58._M_len;
    }
  }
  else {
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_98,err," \'");
    std::operator+(&local_78,&local_98,int_str);
    pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_78,"\'");
    auVar2._8_8_ = &local_48;
    auVar2._0_8_ = pbVar5;
    pcVar1 = (pbVar5->_M_dataplus)._M_p;
    auVar11._8_8_ = pcVar1;
    auVar11._0_8_ = pbVar5;
    local_58._M_len = (size_t)&pbVar5->field_2;
    if (pcVar1 == (pointer)local_58._M_len) {
      local_48 = *(size_type *)local_58._M_len;
      uStack_40 = *(undefined8 *)((long)&pbVar5->field_2 + 8);
      prVar7 = (runtime_error *)local_58._M_len;
      auVar11 = auVar2;
    }
    else {
LAB_0011dd60:
      local_48 = *(size_type *)local_58._M_len;
      prVar7 = (runtime_error *)local_58._M_len;
    }
    local_58._M_len = auVar11._8_8_;
    puVar6 = auVar11._0_8_;
    local_58._M_str = (char *)puVar6[1];
    *puVar6 = prVar7;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    std::runtime_error::runtime_error(prVar8,(string *)&local_58);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
LAB_0011de72:
  __stack_chk_fail();
}

Assistant:

static T TrimAndParse(const std::string& int_str, const std::string& err)
{
    const auto parsed{ToIntegral<T>(TrimStringView(int_str))};
    if (!parsed.has_value()) {
        throw std::runtime_error(err + " '" + int_str + "'");
    }
    return parsed.value();
}